

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCopier.cxx
# Opt level: O2

bool __thiscall cmFileCopier::ReportMissing(cmFileCopier *this,string *fromFile)

{
  cmExecutionStatus *pcVar1;
  ostream *poVar2;
  ostringstream e;
  string local_1b0 [32];
  ostringstream local_190 [376];
  
  std::__cxx11::ostringstream::ostringstream(local_190);
  poVar2 = std::operator<<((ostream *)local_190,this->Name);
  poVar2 = std::operator<<(poVar2," cannot find \"");
  poVar2 = std::operator<<(poVar2,(string *)fromFile);
  poVar2 = std::operator<<(poVar2,"\": ");
  cmsys::SystemTools::GetLastSystemError_abi_cxx11_();
  poVar2 = std::operator<<(poVar2,local_1b0);
  std::operator<<(poVar2,".");
  std::__cxx11::string::~string(local_1b0);
  pcVar1 = this->Status;
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::_M_assign((string *)&pcVar1->Error);
  std::__cxx11::string::~string(local_1b0);
  std::__cxx11::ostringstream::~ostringstream(local_190);
  return false;
}

Assistant:

bool cmFileCopier::ReportMissing(const std::string& fromFile)
{
  // The input file does not exist and installation is not optional.
  std::ostringstream e;
  e << this->Name << " cannot find \"" << fromFile
    << "\": " << cmSystemTools::GetLastSystemError() << ".";
  this->Status.SetError(e.str());
  return false;
}